

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O1

pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::pair<const_google::protobuf::Message_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_int>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Message_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_int>_>_>_>::iterator,_bool>
* __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::pair<google::protobuf::Message_const*,std::__cxx11::string>,std::pair<int,int>>,absl::lts_20250127::hash_internal::Hash<std::pair<google::protobuf::Message_const*,std::__cxx11::string>>,std::equal_to<std::pair<google::protobuf::Message_const*,std::__cxx11::string>>,std::allocator<std::pair<std::pair<google::protobuf::Message_const*,std::__cxx11::string>const,std::pair<int,int>>>>
::find_or_prepare_insert_non_soo<std::pair<google::protobuf::Message_const*,std::__cxx11::string>>
          (pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::pair<const_google::protobuf::Message_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_int>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Message_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_int>_>_>_>::iterator,_bool>
           *__return_storage_ptr__,
          raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::pair<google::protobuf::Message_const*,std::__cxx11::string>,std::pair<int,int>>,absl::lts_20250127::hash_internal::Hash<std::pair<google::protobuf::Message_const*,std::__cxx11::string>>,std::equal_to<std::pair<google::protobuf::Message_const*,std::__cxx11::string>>,std::allocator<std::pair<std::pair<google::protobuf::Message_const*,std::__cxx11::string>const,std::pair<int,int>>>>
          *this,pair<const_google::protobuf::Message_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *key)

{
  char *pcVar1;
  long lVar2;
  uint uVar3;
  ushort uVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  undefined8 uVar13;
  undefined1 uVar14;
  bool bVar15;
  ushort uVar16;
  uintptr_t v;
  uint64_t uVar17;
  size_t sVar18;
  ulong uVar19;
  ctrl_t *pcVar20;
  long lVar21;
  uint uVar22;
  ulong uVar23;
  ulong uVar24;
  bool bVar25;
  PolicyFunctions *in_R9;
  anon_union_8_1_a8a14541_for_iterator_2 aVar26;
  ulong uVar27;
  CommonFields *common;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar34 [16];
  FindInfo target;
  __m128i match;
  PolicyFunctions *local_a0;
  char local_88;
  char cStack_87;
  char cStack_86;
  char cStack_85;
  char cStack_84;
  char cStack_83;
  char cStack_82;
  char cStack_81;
  char cVar28;
  char cVar31;
  char cVar32;
  char cVar33;
  
  uVar23 = ((ulong)key->first ^ 0x1976508) * -0x234dd359734ecb13;
  uVar24 = ((uVar23 >> 0x38 | (uVar23 & 0xff000000000000) >> 0x28 |
             (uVar23 & 0xff0000000000) >> 0x18 | (uVar23 & 0xff00000000) >> 8 |
             (uVar23 & 0xff000000) << 8 | (uVar23 & 0xff0000) << 0x18 | (uVar23 & 0xff00) << 0x28 |
            uVar23 << 0x38) ^ (ulong)key->first) * -0x234dd359734ecb13;
  uVar23 = (key->second)._M_string_length;
  uVar17 = hash_internal::MixingHashState::CombineContiguousImpl
                     (uVar24 >> 0x38 | (uVar24 & 0xff000000000000) >> 0x28 |
                      (uVar24 & 0xff0000000000) >> 0x18 | (uVar24 & 0xff00000000) >> 8 |
                      (uVar24 & 0xff000000) << 8 | (uVar24 & 0xff0000) << 0x18 |
                      (uVar24 & 0xff00) << 0x28 | uVar24 << 0x38,(key->second)._M_dataplus._M_p,
                      uVar23);
  uVar24 = *(ulong *)this;
  if ((uVar24 + 1 & uVar24) != 0) {
    __assert_fail("(((mask + 1) & mask) == 0 && \"not a mask\") && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0x14c,
                  "absl::container_internal::probe_seq<16>::probe_seq(size_t, size_t) [Width = 16]")
    ;
  }
  uVar27 = (uVar17 ^ uVar23) * -0x234dd359734ecb13;
  common = (CommonFields *)
           (uVar27 >> 0x38 | (uVar27 & 0xff000000000000) >> 0x28 | (uVar27 & 0xff0000000000) >> 0x18
            | (uVar27 & 0xff00000000) >> 8 | (uVar27 & 0xff000000) << 8 |
            (uVar27 & 0xff0000) << 0x18 | (uVar27 & 0xff00) << 0x28 | uVar27 << 0x38);
  uVar23 = *(ulong *)(this + 0x10);
  uVar19 = ((ulong)common >> 7 ^ uVar23 >> 0xc) & uVar24;
  uVar14 = (undefined1)(uVar27 >> 0x38);
  auVar29 = ZEXT216(CONCAT11(uVar14,uVar14) & 0x7f7f);
  auVar29 = pshuflw(auVar29,auVar29,0);
  pcVar20 = (__return_storage_ptr__->first).ctrl_;
  aVar26 = (__return_storage_ptr__->first).field_1;
  bVar25 = __return_storage_ptr__->second;
  local_a0 = (PolicyFunctions *)0x0;
  do {
    pcVar1 = (char *)(uVar23 + uVar19);
    local_88 = *pcVar1;
    cStack_87 = pcVar1[1];
    cStack_86 = pcVar1[2];
    cStack_85 = pcVar1[3];
    cStack_84 = pcVar1[4];
    cStack_83 = pcVar1[5];
    cStack_82 = pcVar1[6];
    cStack_81 = pcVar1[7];
    uVar13 = *(undefined8 *)pcVar1;
    cVar5 = pcVar1[8];
    cVar6 = pcVar1[9];
    cVar7 = pcVar1[10];
    cVar8 = pcVar1[0xb];
    cVar9 = pcVar1[0xc];
    cVar10 = pcVar1[0xd];
    cVar11 = pcVar1[0xe];
    cVar12 = pcVar1[0xf];
    cVar28 = auVar29[0];
    auVar30[0] = -(cVar28 == local_88);
    cVar31 = auVar29[1];
    auVar30[1] = -(cVar31 == cStack_87);
    cVar32 = auVar29[2];
    auVar30[2] = -(cVar32 == cStack_86);
    cVar33 = auVar29[3];
    auVar30[3] = -(cVar33 == cStack_85);
    auVar30[4] = -(cVar28 == cStack_84);
    auVar30[5] = -(cVar31 == cStack_83);
    auVar30[6] = -(cVar32 == cStack_82);
    auVar30[7] = -(cVar33 == cStack_81);
    auVar30[8] = -(cVar28 == cVar5);
    auVar30[9] = -(cVar31 == cVar6);
    auVar30[10] = -(cVar32 == cVar7);
    auVar30[0xb] = -(cVar33 == cVar8);
    auVar30[0xc] = -(cVar28 == cVar9);
    auVar30[0xd] = -(cVar31 == cVar10);
    auVar30[0xe] = -(cVar32 == cVar11);
    auVar30[0xf] = -(cVar33 == cVar12);
    uVar16 = (ushort)(SUB161(auVar30 >> 7,0) & 1) | (ushort)(SUB161(auVar30 >> 0xf,0) & 1) << 1 |
             (ushort)(SUB161(auVar30 >> 0x17,0) & 1) << 2 |
             (ushort)(SUB161(auVar30 >> 0x1f,0) & 1) << 3 |
             (ushort)(SUB161(auVar30 >> 0x27,0) & 1) << 4 |
             (ushort)(SUB161(auVar30 >> 0x2f,0) & 1) << 5 |
             (ushort)(SUB161(auVar30 >> 0x37,0) & 1) << 6 |
             (ushort)(SUB161(auVar30 >> 0x3f,0) & 1) << 7 |
             (ushort)(SUB161(auVar30 >> 0x47,0) & 1) << 8 |
             (ushort)(SUB161(auVar30 >> 0x4f,0) & 1) << 9 |
             (ushort)(SUB161(auVar30 >> 0x57,0) & 1) << 10 |
             (ushort)(SUB161(auVar30 >> 0x5f,0) & 1) << 0xb |
             (ushort)(SUB161(auVar30 >> 0x67,0) & 1) << 0xc |
             (ushort)(SUB161(auVar30 >> 0x6f,0) & 1) << 0xd |
             (ushort)(SUB161(auVar30 >> 0x77,0) & 1) << 0xe | (ushort)(auVar30[0xf] >> 7) << 0xf;
    uVar22 = (uint)uVar16;
    while (uVar16 != 0) {
      uVar3 = 0;
      if (uVar22 != 0) {
        for (; (uVar22 >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
        }
      }
      uVar27 = uVar3 + uVar19 & uVar24;
      lVar21 = uVar27 * 0x30;
      bVar15 = std::
               equal_to<std::pair<const_google::protobuf::Message_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator()((equal_to<std::pair<const_google::protobuf::Message_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)this,(pair<const_google::protobuf::Message_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     *)(*(long *)(this + 0x18) + lVar21),key);
      if (bVar15) {
        (__return_storage_ptr__->first).field_1 = aVar26;
        __return_storage_ptr__->second = bVar25;
        (__return_storage_ptr__->first).ctrl_ = pcVar20;
        if (*(long *)(this + 0x10) != 0) {
          lVar2 = *(long *)(this + 0x18);
          (__return_storage_ptr__->first).ctrl_ = (ctrl_t *)(*(long *)(this + 0x10) + uVar27);
          (__return_storage_ptr__->first).field_1.slot_ = (slot_type *)(lVar21 + lVar2);
          __return_storage_ptr__->second = false;
          return __return_storage_ptr__;
        }
        goto LAB_00f0a5e7;
      }
      uVar16 = (ushort)(uVar22 - 1) & (ushort)uVar22;
      uVar22 = CONCAT22((short)(uVar22 - 1 >> 0x10),uVar16);
      local_88 = (char)uVar13;
      cStack_87 = (char)((ulong)uVar13 >> 8);
      cStack_86 = (char)((ulong)uVar13 >> 0x10);
      cStack_85 = (char)((ulong)uVar13 >> 0x18);
      cStack_84 = (char)((ulong)uVar13 >> 0x20);
      cStack_83 = (char)((ulong)uVar13 >> 0x28);
      cStack_82 = (char)((ulong)uVar13 >> 0x30);
      cStack_81 = (char)((ulong)uVar13 >> 0x38);
    }
    auVar34[0] = -(local_88 == -0x80);
    auVar34[1] = -(cStack_87 == -0x80);
    auVar34[2] = -(cStack_86 == -0x80);
    auVar34[3] = -(cStack_85 == -0x80);
    auVar34[4] = -(cStack_84 == -0x80);
    auVar34[5] = -(cStack_83 == -0x80);
    auVar34[6] = -(cStack_82 == -0x80);
    auVar34[7] = -(cStack_81 == -0x80);
    auVar34[8] = -(cVar5 == -0x80);
    auVar34[9] = -(cVar6 == -0x80);
    auVar34[10] = -(cVar7 == -0x80);
    auVar34[0xb] = -(cVar8 == -0x80);
    auVar34[0xc] = -(cVar9 == -0x80);
    auVar34[0xd] = -(cVar10 == -0x80);
    auVar34[0xe] = -(cVar11 == -0x80);
    auVar34[0xf] = -(cVar12 == -0x80);
    uVar16 = (ushort)(SUB161(auVar34 >> 7,0) & 1) | (ushort)(SUB161(auVar34 >> 0xf,0) & 1) << 1 |
             (ushort)(SUB161(auVar34 >> 0x17,0) & 1) << 2 |
             (ushort)(SUB161(auVar34 >> 0x1f,0) & 1) << 3 |
             (ushort)(SUB161(auVar34 >> 0x27,0) & 1) << 4 |
             (ushort)(SUB161(auVar34 >> 0x2f,0) & 1) << 5 |
             (ushort)(SUB161(auVar34 >> 0x37,0) & 1) << 6 |
             (ushort)(SUB161(auVar34 >> 0x3f,0) & 1) << 7 |
             (ushort)(SUB161(auVar34 >> 0x47,0) & 1) << 8 |
             (ushort)(SUB161(auVar34 >> 0x4f,0) & 1) << 9 |
             (ushort)(SUB161(auVar34 >> 0x57,0) & 1) << 10 |
             (ushort)(SUB161(auVar34 >> 0x5f,0) & 1) << 0xb |
             (ushort)(SUB161(auVar34 >> 0x67,0) & 1) << 0xc |
             (ushort)(SUB161(auVar34 >> 0x6f,0) & 1) << 0xd |
             (ushort)(SUB161(auVar34 >> 0x77,0) & 1) << 0xe | (ushort)(auVar34[0xf] >> 7) << 0xf;
    if (uVar16 == 0) {
      if (*(undefined1 **)this < &local_a0->hash_slot) {
        (__return_storage_ptr__->first).field_1 = aVar26;
        __return_storage_ptr__->second = bVar25;
        (__return_storage_ptr__->first).ctrl_ = pcVar20;
        __assert_fail("(seq.index() <= capacity() && \"full table!\") && \"Try enabling sanitizers.\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                      ,0xf7d,
                      "std::pair<iterator, bool> absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<std::pair<const google::protobuf::Message *, std::basic_string<char>>, std::pair<int, int>>, absl::hash_internal::Hash<std::pair<const google::protobuf::Message *, std::basic_string<char>>>, std::equal_to<std::pair<const google::protobuf::Message *, std::basic_string<char>>>, std::allocator<std::pair<const std::pair<const google::protobuf::Message *, std::basic_string<char>>, std::pair<int, int>>>>::find_or_prepare_insert_non_soo(const K &) [Policy = absl::container_internal::FlatHashMapPolicy<std::pair<const google::protobuf::Message *, std::basic_string<char>>, std::pair<int, int>>, Hash = absl::hash_internal::Hash<std::pair<const google::protobuf::Message *, std::basic_string<char>>>, Eq = std::equal_to<std::pair<const google::protobuf::Message *, std::basic_string<char>>>, Alloc = std::allocator<std::pair<const std::pair<const google::protobuf::Message *, std::basic_string<char>>, std::pair<int, int>>>, K = std::pair<const google::protobuf::Message *, std::basic_string<char>>]"
                     );
      }
      uVar19 = (long)&local_a0->hash_slot + uVar19 & uVar24;
      in_R9 = local_a0;
      local_a0 = (PolicyFunctions *)&local_a0->hash_slot;
    }
    else {
      bVar15 = ShouldInsertBackwardsForDebug
                         (*(size_t *)this,(size_t)common,*(ctrl_t **)(this + 0x10));
      if (bVar15) {
        uVar4 = 0xf;
        if (uVar16 != 0) {
          for (; uVar16 >> uVar4 == 0; uVar4 = uVar4 - 1) {
          }
        }
        uVar22 = (ushort)((uVar4 ^ 0xfff0) + 0x11) - 1;
      }
      else {
        uVar22 = 0;
        if (uVar16 != 0) {
          for (; (uVar16 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
          }
        }
      }
      target.probe_length = (size_t)GetPolicyFunctions()::value;
      target.offset = (size_t)local_a0;
      sVar18 = PrepareInsertNonSoo((container_internal *)this,common,uVar22 + uVar19 & uVar24,target
                                   ,in_R9);
      if (*(long *)(this + 0x10) == 0) {
        (__return_storage_ptr__->first).field_1 = aVar26;
        __return_storage_ptr__->second = bVar25;
        (__return_storage_ptr__->first).ctrl_ = pcVar20;
LAB_00f0a5e7:
        __assert_fail("ctrl != nullptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                      ,0x9ef,
                      "absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<std::pair<const google::protobuf::Message *, std::basic_string<char>>, std::pair<int, int>>, absl::hash_internal::Hash<std::pair<const google::protobuf::Message *, std::basic_string<char>>>, std::equal_to<std::pair<const google::protobuf::Message *, std::basic_string<char>>>, std::allocator<std::pair<const std::pair<const google::protobuf::Message *, std::basic_string<char>>, std::pair<int, int>>>>::iterator::iterator(ctrl_t *, slot_type *, const GenerationType *) [Policy = absl::container_internal::FlatHashMapPolicy<std::pair<const google::protobuf::Message *, std::basic_string<char>>, std::pair<int, int>>, Hash = absl::hash_internal::Hash<std::pair<const google::protobuf::Message *, std::basic_string<char>>>, Eq = std::equal_to<std::pair<const google::protobuf::Message *, std::basic_string<char>>>, Alloc = std::allocator<std::pair<const std::pair<const google::protobuf::Message *, std::basic_string<char>>, std::pair<int, int>>>]"
                     );
      }
      pcVar20 = (ctrl_t *)(*(long *)(this + 0x10) + sVar18);
      aVar26.slot_ = (slot_type *)(sVar18 * 0x30 + *(long *)(this + 0x18));
      bVar25 = true;
    }
    if (uVar16 != 0) {
      (__return_storage_ptr__->first).field_1.slot_ = (slot_type *)aVar26;
      __return_storage_ptr__->second = bVar25;
      (__return_storage_ptr__->first).ctrl_ = pcVar20;
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

std::pair<iterator, bool> find_or_prepare_insert_non_soo(const K& key) {
    ABSL_SWISSTABLE_ASSERT(!is_soo());
    prefetch_heap_block();
    auto hash = hash_ref()(key);
    auto seq = probe(common(), hash);
    const ctrl_t* ctrl = control();
    while (true) {
      Group g{ctrl + seq.offset()};
      for (uint32_t i : g.Match(H2(hash))) {
        if (ABSL_PREDICT_TRUE(PolicyTraits::apply(
                EqualElement<K>{key, eq_ref()},
                PolicyTraits::element(slot_array() + seq.offset(i)))))
          return {iterator_at(seq.offset(i)), false};
      }
      auto mask_empty = g.MaskEmpty();
      if (ABSL_PREDICT_TRUE(mask_empty)) {
        size_t target = seq.offset(
            GetInsertionOffset(mask_empty, capacity(), hash, control()));
        return {iterator_at(PrepareInsertNonSoo(common(), hash,
                                                FindInfo{target, seq.index()},
                                                GetPolicyFunctions())),
                true};
      }
      seq.next();
      ABSL_SWISSTABLE_ASSERT(seq.index() <= capacity() && "full table!");
    }
  }